

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

bool __thiscall
Lodtalk::MethodCompiler::generateOptimizedMessage
          (MethodCompiler *this,MessageSendNode *node,CompilerOptimizedSelector optimizedSelector)

{
  bool negated;
  int iVar1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  Node *receiver;
  undefined8 extraout_RAX;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  bool bVar3;
  uint *node_00;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> local_30;
  
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector(&local_30,__x);
  receiver = AST::MessageSendNode::getReceiver(node);
  aVar2.pointer = (uint8_t *)&TrueObject;
  negated = false;
  node_00 = &switchD_00137fb0::switchdataD_0014fd2c;
  switch(optimizedSelector) {
  case IfTrue:
    goto switchD_00137fb0_caseD_0;
  case IfFalse:
    aVar2.pointer = (uint8_t *)&FalseObject;
    goto LAB_00138055;
  case IfTrueIfFalse:
    goto switchD_00137fb0_caseD_2;
  case IfFalseIfTrue:
    aVar2.pointer = (uint8_t *)&FalseObject;
    goto LAB_0013809e;
  case IfNil:
    aVar2.pointer = (uint8_t *)&NilObject;
LAB_00138055:
    negated = false;
    goto switchD_00137fb0_caseD_0;
  case IfNotNil:
    negated = true;
    aVar2.pointer = (uint8_t *)&NilObject;
switchD_00137fb0_caseD_0:
    bVar3 = true;
    generateIfElse(this,(MessageSendNode *)&switchD_00137fb0::switchdataD_0014fd2c,(Oop)aVar2,
                   receiver,*local_30.
                             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,(Node *)0x0,negated);
    goto LAB_001380c0;
  case IfNilIfNotNil:
    aVar2.pointer = (uint8_t *)&NilObject;
LAB_0013809e:
    negated = false;
    goto switchD_00137fb0_caseD_2;
  case IfNotNilIfNil:
    negated = true;
    aVar2.pointer = (uint8_t *)&NilObject;
switchD_00137fb0_caseD_2:
    bVar3 = true;
    generateIfElse(this,(MessageSendNode *)&switchD_00137fb0::switchdataD_0014fd2c,(Oop)aVar2,
                   receiver,*local_30.
                             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   local_30.
                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[1],negated);
    goto LAB_001380c0;
  case WhileTrue:
switchD_00137fb0_caseD_8:
    iVar1 = (*receiver->_vptr_Node[5])(receiver);
    if ((char)iVar1 != '\0') {
      aVar2.pointer = (uint8_t *)&TrueObject;
LAB_00138032:
      bVar3 = true;
      generateWhile(this,(MessageSendNode *)node_00,(Oop)aVar2,receiver,
                    *local_30.
                     super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_001380c0;
    }
    break;
  case WhileFalse:
    iVar1 = (*receiver->_vptr_Node[5])(receiver);
    if ((char)iVar1 != '\0') {
      aVar2.pointer = (uint8_t *)&FalseObject;
      goto LAB_00138032;
    }
    break;
  default:
    generateOptimizedMessage();
    if (local_30.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  case ToByDo:
    iVar1 = (*local_30.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[2]->_vptr_Node[5])();
    if ((char)iVar1 != '\0') {
      generateOptimizedMessage();
      goto switchD_00137fb0_caseD_8;
    }
    break;
  case ToDo:
    iVar1 = (*local_30.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[1]->_vptr_Node[5])();
    if ((char)iVar1 != '\0') {
      bVar3 = true;
      generateToDo(this,(MessageSendNode *)node_00,receiver,
                   *local_30.
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                   local_30.
                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[1]);
      goto LAB_001380c0;
    }
  }
  bVar3 = false;
LAB_001380c0:
  if (local_30.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool MethodCompiler::generateOptimizedMessage(MessageSendNode *node, CompilerOptimizedSelector optimizedSelector)
{
    auto arguments = node->getArguments();
    auto receiver = node->getReceiver();

    switch(optimizedSelector)
    {
    case CompilerOptimizedSelector::IfTrue:
        generateIf(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfFalse:
        generateIf(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNil:
        generateIf(node, nilOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNotNil:
        generateIf(node, nilOop(), receiver, arguments[0], true);
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
        generateIfElse(node, trueOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfFalseIfTrue:
        generateIfElse(node, falseOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNilIfNotNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNotNilIfNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1], true);
        break;
    case CompilerOptimizedSelector::WhileTrue:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::WhileFalse:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::ToDo:
        if(!arguments[1]->isBlockExpression())
            return false;
        generateToDo(node, receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::ToByDo:
        if(!arguments[2]->isBlockExpression())
            return false;
        generateToByDo(node, receiver, arguments[0], arguments[1], arguments[2]);
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}